

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

char * mbedtls_ssl_get_version(mbedtls_ssl_context *ssl)

{
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  
  uVar1 = (ulong)(uint)ssl->minor_ver;
  if ((ssl->conf->field_0x174 & 2) != 0) {
    pcVar3 = "unknown (DTLS)";
    if (uVar1 == 3) {
      pcVar3 = "DTLSv1.2";
    }
    pcVar2 = "DTLSv1.0";
    if (uVar1 != 2) {
      pcVar2 = pcVar3;
    }
    return pcVar2;
  }
  if ((uint)ssl->minor_ver < 4) {
    return &DAT_0015185c + *(int *)(&DAT_0015185c + uVar1 * 4);
  }
  return "unknown";
}

Assistant:

const char *mbedtls_ssl_get_version( const mbedtls_ssl_context *ssl )
{
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        switch( ssl->minor_ver )
        {
            case MBEDTLS_SSL_MINOR_VERSION_2:
                return( "DTLSv1.0" );

            case MBEDTLS_SSL_MINOR_VERSION_3:
                return( "DTLSv1.2" );

            default:
                return( "unknown (DTLS)" );
        }
    }
#endif

    switch( ssl->minor_ver )
    {
        case MBEDTLS_SSL_MINOR_VERSION_0:
            return( "SSLv3.0" );

        case MBEDTLS_SSL_MINOR_VERSION_1:
            return( "TLSv1.0" );

        case MBEDTLS_SSL_MINOR_VERSION_2:
            return( "TLSv1.1" );

        case MBEDTLS_SSL_MINOR_VERSION_3:
            return( "TLSv1.2" );

        default:
            return( "unknown" );
    }
}